

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QPlatformTextureListWatcher::onLockStatusChanged(QPlatformTextureListWatcher *this,bool locked)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  bool *pbVar4;
  byte in_SIL;
  QPlatformTextureListWatcher *in_RDI;
  long in_FS_OFFSET;
  QPlatformTextureList *tl;
  undefined7 in_stack_ffffffffffffffe0;
  QPlatformTextureListWatcher *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  this_00 = in_RDI;
  QObject::sender();
  pbVar4 = QHash<QPlatformTextureList_*,_bool>::operator[]
                     ((QHash<QPlatformTextureList_*,_bool> *)
                      CONCAT17(bVar2,in_stack_ffffffffffffffe0),(QPlatformTextureList **)in_RDI);
  *pbVar4 = (bool)(bVar2 & 1);
  bVar3 = isLocked(this_00);
  if (!bVar3) {
    QWidgetRepaintManager::sync((QWidgetRepaintManager *)in_RDI->m_repaintManager);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void onLockStatusChanged(bool locked) {
        QPlatformTextureList *tl = static_cast<QPlatformTextureList *>(sender());
        m_locked[tl] = locked;
        if (!isLocked())
            m_repaintManager->sync();
     }